

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O0

void __thiscall
mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::WriteVarBounds
          (NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_> *this)

{
  NLHeader *pNVar1;
  NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_> *in_RDI;
  ExampleNLFeeder *unaff_retaddr;
  VarBndWriter vbw;
  VarBndWriter local_18;
  NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_> *vbw_00;
  
  vbw_00 = in_RDI;
  pNVar1 = Hdr(in_RDI);
  BinaryFormatter::apr
            (&in_RDI->super_FormatterType,&in_RDI->nm,"b\t#%d bounds (on variables)\n",
             (ulong)(uint)(pNVar1->super_NLProblemInfo).super_NLProblemInfo_C.num_vars);
  VarBndWriter::VarBndWriter(&local_18,in_RDI);
  Feeder(in_RDI);
  ExampleNLFeeder::
  FeedVarBounds<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,ExampleNLFeeder>>::VarBndWriter>
            (unaff_retaddr,(VarBndWriter *)vbw_00);
  return;
}

Assistant:

void NLWriter2<Params>::WriteVarBounds() {
	apr(nm, "b\t#%d bounds (on variables)\n",
      (int)Hdr().num_vars);
  VarBndWriter vbw(*this);
  Feeder().FeedVarBounds(vbw);
  assert((int)Hdr().num_vars == vbw.GetNWritten());
}